

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

int __thiscall Jupiter::Socket::connect(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  Data *pDVar1;
  char *hostname;
  int iVar2;
  addrinfo *__ai;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  uint in_R8D;
  int iVar3;
  addrinfo *paVar4;
  string local_50;
  
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&this->m_data->remote_host,(char *)CONCAT44(in_register_00000034,__fd));
  pDVar1 = this->m_data;
  pDVar1->remote_port = (unsigned_short)__addr;
  hostname = (pDVar1->remote_host)._M_dataplus._M_p;
  std::__cxx11::to_string(&local_50,(int)__addr);
  __ai = getAddrInfo(hostname,local_50._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_50);
  if (__ai == (addrinfo *)0x0) {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    paVar4 = __ai;
    do {
      if (CONCAT44(in_register_0000000c,__len) == 0) {
        iVar2 = socket(paVar4->ai_family,this->m_data->sockType,this->m_data->sockProto);
        this->m_data->rawSock = iVar2;
        if (iVar2 != -1) goto LAB_0014772f;
      }
      else {
        iVar2 = bind(this,__len,(sockaddr *)(ulong)(in_R8D & 0xffff),0);
        if ((char)iVar2 == '\0') goto LAB_0014776b;
        iVar2 = this->m_data->rawSock;
LAB_0014772f:
        iVar2 = ::connect(iVar2,(sockaddr *)paVar4->ai_addr,paVar4->ai_addrlen);
        if (iVar2 != -1) {
          iVar3 = 1;
          goto LAB_0014776b;
        }
        ::close(this->m_data->rawSock);
        this->m_data->rawSock = -1;
      }
      paVar4 = paVar4->ai_next;
    } while (paVar4 != (addrinfo *)0x0);
    iVar3 = 0;
LAB_0014776b:
    freeaddrinfo((addrinfo *)__ai);
  }
  return iVar3;
}

Assistant:

bool Jupiter::Socket::connect(const char *hostname, unsigned short iPort, const char *clientAddress, unsigned short clientPort) {
#if defined _WIN32
	if (!socketInit && !Jupiter::Socket::init())
		return false;
#endif // _WIN32
	m_data->remote_host = hostname;
	m_data->remote_port = iPort;
	addrinfo *info_head = Jupiter::Socket::getAddrInfo(m_data->remote_host.c_str(), std::to_string(m_data->remote_port).c_str());
	if (info_head != nullptr) {
		addrinfo *info = info_head;
		do {
			if (clientAddress != nullptr) {
				// bind will initialize our socket
				if (Jupiter::Socket::bind(clientAddress, clientPort, false) == false)
					break;
			}
			else {
				m_data->rawSock = socket(info->ai_family, m_data->sockType, m_data->sockProto);
				if (m_data->rawSock == INVALID_SOCKET) {
					info = info->ai_next;
					continue;
				}
			}

			if (::connect(m_data->rawSock, info->ai_addr, info->ai_addrlen) == SOCKET_ERROR) {
#if defined _WIN32
				::closesocket(m_data->rawSock);
#else // _WIN32
				::close(m_data->rawSock);
#endif // WIN32
				m_data->rawSock = INVALID_SOCKET;
				info = info->ai_next;
				continue;
			}

			Jupiter::Socket::freeAddrInfo(info_head);
			return true;
		} while (info != nullptr);
		Jupiter::Socket::freeAddrInfo(info_head);
	}
	return false;
}